

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O0

int Abc_NtkTestTimNodeStrash(Gia_Man_t *pGia,Abc_Obj_t *pNode)

{
  Hop_Man_t *p;
  Hop_Obj_t *p_00;
  int iVar1;
  int c;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *pHVar3;
  Abc_Obj_t *pAVar4;
  int local_3c;
  int i;
  Abc_Obj_t *pFanin;
  Hop_Obj_t *pRoot;
  Hop_Man_t *pMan;
  Abc_Obj_t *pNode_local;
  Gia_Man_t *pGia_local;
  
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                  ,0x47,"int Abc_NtkTestTimNodeStrash(Gia_Man_t *, Abc_Obj_t *)");
  }
  iVar1 = Abc_NtkIsAigLogic(pNode->pNtk);
  if (iVar1 != 0) {
    p = (Hop_Man_t *)pNode->pNtk->pManFunc;
    p_00 = *(Hop_Obj_t **)&(pNode->field_5).iData;
    iVar1 = Abc_NodeIsConst(pNode);
    if (iVar1 == 0) {
      pHVar2 = Hop_Regular(p_00);
      pHVar3 = Hop_ManConst1(p);
      if (pHVar2 != pHVar3) {
        for (local_3c = 0; iVar1 = Abc_ObjFaninNum(pNode), local_3c < iVar1; local_3c = local_3c + 1
            ) {
          pAVar4 = Abc_ObjFanin(pNode,local_3c);
          iVar1 = (pAVar4->field_6).iTemp;
          pHVar2 = Hop_IthVar(p,local_3c);
          (pHVar2->field_0).iData = iVar1;
        }
        pHVar2 = Hop_Regular(p_00);
        Abc_NtkTestTimNodeStrash_rec(pGia,pHVar2);
        pHVar2 = Hop_Regular(p_00);
        Hop_ConeUnmark_rec(pHVar2);
        pHVar2 = Hop_Regular(p_00);
        iVar1 = (pHVar2->field_0).iData;
        c = Hop_IsComplement(p_00);
        iVar1 = Abc_LitNotCond(iVar1,c);
        return iVar1;
      }
    }
    iVar1 = Hop_IsComplement(p_00);
    return (uint)((iVar1 != 0 ^ 0xffU) & 1);
  }
  __assert_fail("Abc_NtkIsAigLogic(pNode->pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                ,0x48,"int Abc_NtkTestTimNodeStrash(Gia_Man_t *, Abc_Obj_t *)");
}

Assistant:

int Abc_NtkTestTimNodeStrash( Gia_Man_t * pGia, Abc_Obj_t * pNode )
{
    Hop_Man_t * pMan;
    Hop_Obj_t * pRoot;
    Abc_Obj_t * pFanin;
    int i;
    assert( Abc_ObjIsNode(pNode) );
    assert( Abc_NtkIsAigLogic(pNode->pNtk) );
    // get the local AIG manager and the local root node
    pMan = (Hop_Man_t *)pNode->pNtk->pManFunc;
    pRoot = (Hop_Obj_t *)pNode->pData;
    // check the constant case
    if ( Abc_NodeIsConst(pNode) || Hop_Regular(pRoot) == Hop_ManConst1(pMan) )
        return !Hop_IsComplement(pRoot);
    // set elementary variables
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Hop_IthVar(pMan, i)->iData = pFanin->iTemp;
    // strash the AIG of this node
    Abc_NtkTestTimNodeStrash_rec( pGia, Hop_Regular(pRoot) );
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    // return the final node with complement if needed
    return Abc_LitNotCond( Hop_Regular(pRoot)->iData, Hop_IsComplement(pRoot) );
}